

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testLargePoints
          (TestStatus *__return_storage_ptr__,Context *context)

{
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  ProgramBinary *pPVar2;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *this_01;
  allocator<char> local_591;
  string local_590;
  byte local_56b;
  byte local_56a;
  allocator<char> local_569;
  string local_568;
  Vector<float,_4> local_548;
  Vector<float,_4> local_538;
  ConstPixelBufferAccess local_528;
  int local_4fc;
  undefined1 local_4f8 [4];
  int numBlackPixels;
  VulkanDrawContext drawContext;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  TestLog *log;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  undefined4 local_d0;
  undefined4 local_cc;
  float p;
  float delta;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  string local_a8;
  Shader local_88 [2];
  allocator<char> local_61;
  string local_60;
  Shader local_40;
  undefined1 local_30 [8];
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  Context *context_local;
  
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice
                         ((Context *)
                          shaders.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  requireFeatures(vki,physDevice,0x80);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_30);
  pPVar1 = Context::getBinaryCollection
                     ((Context *)
                      shaders.
                      super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"vert",&local_61);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_60);
  drawutil::Shader::Shader(&local_40,VK_SHADER_STAGE_VERTEX_BIT,pPVar2);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_30,
             &local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pPVar1 = Context::getBinaryCollection
                     ((Context *)
                      shaders.
                      super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"frag",
             (allocator<char> *)
             ((long)&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_a8);
  drawutil::Shader::Shader(local_88,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar2);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_30,
             local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p);
  local_cc = 0x3dcccccd;
  local_d0 = 0x3f8ccccd;
  tcu::Vector<float,_4>::Vector(&local_e0,-1.1,-1.1,0.1,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_e0)
  ;
  tcu::Vector<float,_4>::Vector(&local_f0,-1.1,1.1,0.2,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_f0)
  ;
  tcu::Vector<float,_4>::Vector(&local_100,1.1,1.1,0.4,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_100
            );
  tcu::Vector<float,_4>::Vector(&local_110,1.1,-1.1,0.6,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_110
            );
  tcu::Vector<float,_4>::Vector(&local_120,0.0,-1.1,0.8,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_120
            );
  tcu::Vector<float,_4>::Vector(&local_130,1.1,0.0,0.9,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_130
            );
  tcu::Vector<float,_4>::Vector(&local_140,0.0,1.1,0.1,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,&local_140
            );
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-1.1,0.0,0.2,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p,
             (value_type *)&log);
  this = Context::getTestContext
                   ((Context *)
                    shaders.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = tcu::TestContext::getLog(this);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&drawState.lineWidth,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&drawState.lineWidth,
                       (char (*) [85])
                       "Drawing several large points just outside the clip volume. Expecting an empty image."
                      );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&drawState.lineWidth);
  drawutil::DrawState::DrawState
            ((DrawState *)((long)&drawCallData.vertices + 4),VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0x10,
             0x10);
  drawutil::DrawCallData::DrawCallData
            ((DrawCallData *)&vulkanProgram,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p);
  drawutil::VulkanProgram::VulkanProgram
            ((VulkanProgram *)
             &drawContext.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8,
             (vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_30);
  drawutil::VulkanDrawContext::VulkanDrawContext
            ((VulkanDrawContext *)local_4f8,
             (Context *)
             shaders.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (DrawState *)((long)&drawCallData.vertices + 4),(DrawCallData *)&vulkanProgram,
             (VulkanProgram *)
             &drawContext.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8);
  drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_4f8);
  drawutil::VulkanDrawContext::getColorPixels(&local_528,(VulkanDrawContext *)local_4f8);
  tcu::Vector<float,_4>::Vector(&local_538,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_548);
  local_4fc = countPixels(&local_528,&local_538,&local_548);
  local_56a = 0;
  local_56b = 0;
  if (local_4fc == 0x100) {
    std::allocator<char>::allocator();
    local_56a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"OK",&local_569);
    local_56b = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_568);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"Rendered image(s) are incorrect",&local_591);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
  }
  if ((local_56b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_568);
  }
  if ((local_56a & 1) != 0) {
    std::allocator<char>::~allocator(&local_569);
  }
  drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_4f8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&p);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testLargePoints (Context& context)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_LARGE_POINTS);

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		const float delta	= 0.1f;  // much smaller than the point size
		const float p		= 1.0f + delta;

		vertices.push_back(Vec4(  -p,   -p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p,    p, 0.2f, 1.0f));
		vertices.push_back(Vec4(   p,    p, 0.4f, 1.0f));
		vertices.push_back(Vec4(   p,   -p, 0.6f, 1.0f));
		vertices.push_back(Vec4(0.0f,   -p, 0.8f, 1.0f));
		vertices.push_back(Vec4(   p, 0.0f, 0.9f, 1.0f));
		vertices.push_back(Vec4(0.0f,    p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p, 0.0f, 0.2f, 1.0f));
	}

	tcu::TestLog&	log	= context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing several large points just outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	DrawState			drawState		(VK_PRIMITIVE_TOPOLOGY_POINT_LIST, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// All pixels must be black -- nothing is drawn.
	const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == NUM_RENDER_PIXELS ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}